

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

Instr * __thiscall
Inline::InlineApplyWithoutArrayArgument
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *applyInfo,
          FunctionJITTimeInfo *applyTargetInfo)

{
  OpCode OVar1;
  code *pcVar2;
  Instr *pIVar3;
  Instr *pIVar4;
  bool bVar5;
  undefined4 *puVar6;
  Instr *pIVar7;
  RegOpnd *dstOpnd;
  IntConstOpnd *src1Opnd;
  StackSym *pSVar8;
  SymOpnd *dstOpnd_00;
  ByteCodeUsesInstr *this_00;
  Inline *this_01;
  byte bVar9;
  bool bVar10;
  Instr *local_70;
  Instr *implicitThisArgOut;
  Instr *dummyInstr;
  Instr *pIStack_58;
  uint argOutCount;
  Instr *explicitThisArgOut;
  Inline *local_48;
  Instr *local_40;
  bool local_31 [8];
  bool safeThis;
  
  pIVar7 = callInstr->m_next;
  local_70 = (Instr *)0x0;
  pIStack_58 = (Instr *)0x0;
  implicitThisArgOut = (Instr *)0x0;
  dummyInstr._4_4_ = 0;
  explicitThisArgOut = (Instr *)applyTargetInfo;
  local_48 = this;
  GetArgInstrsForCallAndApply
            (this,callInstr,&local_70,&stack0xffffffffffffffa8,&implicitThisArgOut,
             (uint *)((long)&dummyInstr + 4));
  pIVar3 = local_70;
  if (local_70 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xacd,"(implicitThisArgOut)","implicitThisArgOut");
    if (!bVar5) goto LAB_00557b38;
    *puVar6 = 0;
  }
  pIVar4 = pIStack_58;
  local_40 = pIVar7;
  if (pIStack_58 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xace,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar5) goto LAB_00557b38;
    *puVar6 = 0;
  }
  this_01 = local_48;
  EmitFixedMethodOrFunctionObjectChecksForBuiltIns
            (local_48,callInstr,callInstr,applyInfo,false,true,false,true);
  pIVar7 = InsertInlineeBuiltInStartEndTags(this_01,callInstr,2,(Instr **)0x0);
  pIVar7->m_opcode = InlineNonTrackingBuiltInEnd;
  dstOpnd = IR::RegOpnd::New(TyVar,callInstr->m_func);
  src1Opnd = IR::IntConstOpnd::New(1,TyInt32,callInstr->m_func,false);
  pIVar7 = IR::Instr::New(StartCall,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,callInstr->m_func);
  IR::Instr::InsertBefore(callInstr,pIVar7);
  pSVar8 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,1);
  dstOpnd_00 = IR::SymOpnd::New(&pSVar8->super_Sym,0,TyVar,callInstr->m_func);
  pIVar7 = IR::Instr::New(ArgOut_A,&dstOpnd_00->super_Opnd,pIVar4->m_src1,pIVar7->m_dst,
                          callInstr->m_func);
  IR::Instr::InsertBefore(callInstr,pIVar7);
  IR::Instr::ReplaceSrc1(callInstr,pIVar3->m_src1);
  IR::Instr::ReplaceSrc2(callInstr,&dstOpnd_00->super_Opnd);
  callInstr->m_opcode = CallI;
  pSVar8 = IR::Opnd::GetStackSym(callInstr->m_src1);
  pIVar3 = local_40;
  bVar9 = callInstr->m_src1->field_0xb;
  bVar10 = (pSVar8->field_0x18 & 1) == 0;
  pIVar7 = (pSVar8->field_5).m_instrDef;
  bVar5 = pIVar7 == (Instr *)0x0 || bVar10;
  if (pIVar7 != (Instr *)0x0 && !bVar10) {
    OVar1 = pIVar7->m_opcode;
    while (OVar1 == BytecodeArgOutCapture) {
      bVar9 = pIVar7->m_src1->field_0xb;
      pSVar8 = IR::Opnd::GetStackSym(pIVar7->m_src1);
      pIVar7 = (pSVar8->field_5).m_instrDef;
      bVar5 = pIVar7 == (Instr *)0x0 || (pSVar8->field_0x18 & 1) == 0;
      if (bVar5) break;
      OVar1 = pIVar7->m_opcode;
    }
  }
  if ((explicitThisArgOut != (Instr *)0x0) && (!bVar5)) {
    local_31[0] = false;
    bVar5 = TryOptimizeCallInstrWithFixedMethod
                      (local_48,callInstr,(FunctionJITTimeInfo *)explicitThisArgOut,false,false,
                       false,true,local_31,false,0);
    if (bVar5) {
      if (callInstr->m_opcode != CallIFixed) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0xaf9,"(callInstr->m_opcode == Js::OpCode::CallIFixed)",
                           "callInstr->m_opcode == Js::OpCode::CallIFixed");
        if (!bVar5) {
LAB_00557b38:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      this_00 = IR::ByteCodeUsesInstr::New(callInstr);
      IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
                (this_00,(bool)((bVar9 & 8) >> 3),(pSVar8->super_Sym).m_id);
      IR::Instr::InsertBefore(callInstr,&this_00->super_Instr);
    }
  }
  return pIVar3;
}

Assistant:

IR::Instr * Inline::InlineApplyWithoutArrayArgument(IR::Instr *callInstr, const FunctionJITTimeInfo * applyInfo, const FunctionJITTimeInfo * applyTargetInfo)
{
    IR::Instr * instrNext = callInstr->m_next;
    IR::Instr * implicitThisArgOut = nullptr;
    IR::Instr * explicitThisArgOut = nullptr;
    IR::Instr * dummyInstr = nullptr;
    uint argOutCount = 0;
    this->GetArgInstrsForCallAndApply(callInstr, &implicitThisArgOut, &explicitThisArgOut, &dummyInstr, argOutCount);

    Assert(implicitThisArgOut);
    Assert(explicitThisArgOut);

    EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, callInstr, applyInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/);

    IR::Instr *instr = InsertInlineeBuiltInStartEndTags(callInstr, 2); // 2 args (implicit this + explicit this)
    instr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd;

    IR::Instr * startCall = IR::Instr::New(Js::OpCode::StartCall,
        IR::RegOpnd::New(TyVar, callInstr->m_func),
        IR::IntConstOpnd::New(1, TyInt32, callInstr->m_func),
        callInstr->m_func);
    callInstr->InsertBefore(startCall);

    StackSym* symDst = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1));
    IR::SymOpnd* linkOpnd = IR::SymOpnd::New(symDst, 0, TyVar, callInstr->m_func);
    IR::Instr* thisArgOut = IR::Instr::New(Js::OpCode::ArgOut_A, linkOpnd, explicitThisArgOut->GetSrc1(), startCall->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(thisArgOut);

    callInstr->ReplaceSrc1(implicitThisArgOut->GetSrc1());
    callInstr->ReplaceSrc2(linkOpnd);
    callInstr->m_opcode = Js::OpCode::CallI;

    StackSym* callTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool callTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();
    while (callTargetStackSym->IsSingleDef() && callTargetStackSym->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture)
    {
        callTargetOpndIsJITOpt = callTargetStackSym->GetInstrDef()->GetSrc1()->GetIsJITOptimizedReg();
        callTargetStackSym = callTargetStackSym->GetInstrDef()->GetSrc1()->GetStackSym();
    }

    if (!callTargetStackSym->IsSingleDef())
    {
        return instrNext;
    }

    if (!applyTargetInfo)
    {
        return instrNext;
    }

    bool safeThis = false;
    if (TryOptimizeCallInstrWithFixedMethod(callInstr, applyTargetInfo, false /*isPolymorphic*/, false /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/, safeThis /*unused here*/))
    {
        Assert(callInstr->m_opcode == Js::OpCode::CallIFixed);
        IR::ByteCodeUsesInstr* bytecodeUses = IR::ByteCodeUsesInstr::New(callInstr);
        bytecodeUses->SetRemovedOpndSymbol(callTargetOpndIsJITOpt, callTargetStackSym->m_id);
        callInstr->InsertBefore(bytecodeUses);
    }

    return instrNext;
}